

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lists.cc
# Opt level: O3

void __thiscall
Lists<std::shared_ptr<Itemset>_>::prepend
          (Lists<std::shared_ptr<Itemset>_> *this,shared_ptr<Itemset> *item)

{
  element_type *peVar1;
  shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *psVar2;
  ListNodes<std::shared_ptr<Itemset>_> *__p;
  shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> node;
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  undefined8 local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  element_type *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  local_58 = (element_type *)0x0;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->theSize = this->theSize + 1;
  __p = (ListNodes<std::shared_ptr<Itemset>_> *)operator_new(0x20);
  local_48 = (item->super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_40._M_pi = (item->super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_40._M_pi)->_M_use_count = (local_40._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_40._M_pi)->_M_use_count = (local_40._M_pi)->_M_use_count + 1;
    }
  }
  local_38 = 0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__p->theItem).super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__p->theItem).super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__p->theNext).
  super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__p->theNext).
  super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__p->theItem).super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_48;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(__p->theItem).super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_40);
  (__p->theNext).
  super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(__p->theNext).
              super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&_Stack_30);
  std::__shared_ptr<ListNodes<std::shared_ptr<Itemset>>,(__gnu_cxx::_Lock_policy)2>::
  reset<ListNodes<std::shared_ptr<Itemset>>>
            ((__shared_ptr<ListNodes<std::shared_ptr<Itemset>>,(__gnu_cxx::_Lock_policy)2> *)
             &local_58,__p);
  if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
  }
  if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
  }
  peVar1 = (this->theHead).
           super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    (this->theHead).
    super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_58;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->theHead).
                super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,&_Stack_50);
    (this->theLast).
    super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_58;
    psVar2 = &this->theLast;
  }
  else {
    local_20._M_pi =
         (this->theHead).
         super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
      }
    }
    psVar2 = &this->theHead;
    (local_58->theNext).
    super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar1;
    local_28 = peVar1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(local_58->theNext).
                super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,&local_20);
    if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
    }
    (this->theHead).
    super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_58;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(psVar2->
              super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount,&_Stack_50);
  if (_Stack_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_50._M_pi);
  }
  return;
}

Assistant:

void Lists<T>::prepend(T item) {
    shared_ptr<ListNodes<T>> node;

    theSize++;
    node.reset(new ListNodes<T>(item, 0));

    if (theHead == 0) {
        theHead = node;
        theLast = node;
    } else {
        node->set_next(theHead);
        theHead = node;
    }
}